

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  char *pcVar2;
  undefined1 local_d0 [8];
  cmParseFileScope pfs;
  cmListFile listFile;
  ListFileScope scope;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string filenametoread;
  char *filename_local;
  cmMakefile *this_local;
  
  filenametoread.field_2._8_8_ = filename;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,filename,&local_61);
  pcVar2 = GetCurrentSourceDirectory(this);
  cmsys::SystemTools::CollapseFullPath((string *)local_40,&local_60,pcVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  ListFileScope::ListFileScope
            ((ListFileScope *)
             &listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,(string *)local_40);
  cmListFile::cmListFile((cmListFile *)&pfs.Context.Line);
  cmParseFileScope::cmParseFileScope((cmParseFileScope *)local_d0,this);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmListFile::ParseFile((cmListFile *)&pfs.Context.Line,pcVar2,false,this);
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  cmParseFileScope::~cmParseFileScope((cmParseFileScope *)local_d0);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&pfs.Context.Line,(string *)local_40);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      ListFileScope::Quiet
                ((ListFileScope *)
                 &listFile.Functions.
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    this_local._7_1_ = 1;
  }
  cmListFile::~cmListFile((cmListFile *)&pfs.Context.Line);
  ListFileScope::~ListFileScope
            ((ListFileScope *)
             &listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }
  }

  this->ReadListFile(listFile, filenametoread);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    scope.Quiet();
    }
  return true;
}